

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Input::kf_move_down_and_eol(Fl_Input *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Fl_Input *this_local;
  
  iVar2 = Fl_Input_::position(&this->super_Fl_Input_);
  iVar2 = Fl_Input_::line_end(&this->super_Fl_Input_,iVar2);
  iVar3 = Fl_Input_::position(&this->super_Fl_Input_);
  if (iVar2 == iVar3) {
    iVar2 = Fl_Input_::position(&this->super_Fl_Input_);
    iVar3 = Fl_Input_::size(&this->super_Fl_Input_);
    if (iVar2 < iVar3) {
      iVar2 = Fl_Input_::position(&this->super_Fl_Input_);
      iVar2 = Fl_Input_::line_end(&this->super_Fl_Input_,iVar2 + 1);
      iVar2 = shift_position(this,iVar2);
      bVar1 = Fl::option(OPTION_ARROW_FOCUS);
      return iVar2 + (uint)!bVar1;
    }
  }
  iVar2 = Fl_Input_::position(&this->super_Fl_Input_);
  iVar2 = Fl_Input_::line_end(&this->super_Fl_Input_,iVar2);
  iVar2 = shift_position(this,iVar2);
  bVar1 = Fl::option(OPTION_ARROW_FOCUS);
  return iVar2 + (uint)!bVar1;
}

Assistant:

int Fl_Input::kf_move_down_and_eol() {
  if (line_end(position())==position() && position()<size())
    return shift_position(line_end(position()+1)) + NORMAL_INPUT_MOVE;
  else
    return shift_position(line_end(position())) + NORMAL_INPUT_MOVE;
}